

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

void stbtt__tesselate_cubic
               (stbtt__point *points,int *num_points,float x0,float y0,float x1,float y1,float x2,
               float y2,float x3,float y3,float objspace_flatness_squared,int n)

{
  int iVar1;
  int n_00;
  bool bVar2;
  float in_XMM0_Db;
  float in_XMM1_Db;
  float in_XMM2_Db;
  float in_XMM3_Db;
  float in_XMM4_Db;
  float fVar3;
  float y2_00;
  float in_XMM5_Db;
  float y1_00;
  float in_XMM6_Db;
  undefined1 auVar4 [16];
  float fVar5;
  float x1_00;
  float in_XMM7_Db;
  float fVar6;
  
  iVar1 = 0x11;
  if (0x11 < n) {
    iVar1 = n;
  }
  if (n < 0x11) {
    n_00 = n + 1;
    do {
      fVar6 = SQRT((x3 - x0) * (x3 - x0) + (y3 - y0) * (y3 - y0));
      auVar4._0_4_ = (x1 - x0) * (x1 - x0) + (y1 - y0) * (y1 - y0);
      auVar4._4_4_ = (x2 - x1) * (x2 - x1) + (y2 - y1) * (y2 - y1);
      auVar4._8_4_ = (in_XMM0_Db - in_XMM0_Db) * (in_XMM0_Db - in_XMM0_Db) +
                     (in_XMM1_Db - in_XMM1_Db) * (in_XMM1_Db - in_XMM1_Db);
      auVar4._12_4_ =
           (in_XMM4_Db - in_XMM4_Db) * (in_XMM4_Db - in_XMM4_Db) +
           (in_XMM5_Db - in_XMM5_Db) * (in_XMM5_Db - in_XMM5_Db);
      auVar4 = sqrtps(auVar4,auVar4);
      fVar5 = auVar4._4_4_ + auVar4._0_4_ + SQRT((x3 - x2) * (x3 - x2) + (y3 - y2) * (y3 - y2));
      if (fVar5 * fVar5 - fVar6 * fVar6 <= objspace_flatness_squared) {
        iVar1 = *num_points;
        if (points != (stbtt__point *)0x0) {
          points[iVar1].x = x3;
          points[iVar1].y = y3;
        }
        *num_points = iVar1 + 1;
        return;
      }
      fVar5 = (x2 + x1) * 0.5;
      fVar3 = (y2 + y1) * 0.5;
      x1_00 = (x1 + x0) * 0.5;
      x2 = (x3 + x2) * 0.5;
      in_XMM0_Db = (in_XMM2_Db + in_XMM0_Db) * 0.0;
      in_XMM4_Db = (in_XMM6_Db + in_XMM4_Db) * 0.0;
      fVar6 = (fVar5 + x1_00) * 0.5;
      x1 = (fVar5 + x2) * 0.5;
      y1_00 = (y1 + y0) * 0.5;
      y2 = (y3 + y2) * 0.5;
      in_XMM1_Db = (in_XMM3_Db + in_XMM1_Db) * 0.0;
      in_XMM5_Db = (in_XMM7_Db + in_XMM5_Db) * 0.0;
      y2_00 = (fVar3 + y1_00) * 0.5;
      y1 = (fVar3 + y2) * 0.5;
      fVar3 = (x1 + fVar6) * 0.5;
      fVar5 = (y1 + y2_00) * 0.5;
      stbtt__tesselate_cubic
                (points,num_points,x0,y0,x1_00,y1_00,fVar6,y2_00,fVar3,fVar5,
                 objspace_flatness_squared,n_00);
      bVar2 = n_00 != iVar1;
      x0 = fVar3;
      y0 = fVar5;
      in_XMM2_Db = x1;
      in_XMM3_Db = y1;
      n_00 = n_00 + 1;
    } while (bVar2);
  }
  return;
}

Assistant:

static void stbtt__tesselate_cubic(stbtt__point *points, int *num_points, float x0, float y0, float x1, float y1, float x2, float y2, float x3, float y3, float objspace_flatness_squared, int n)
{
   // @TODO this "flatness" calculation is just made-up nonsense that seems to work well enough
   float dx0 = x1-x0;
   float dy0 = y1-y0;
   float dx1 = x2-x1;
   float dy1 = y2-y1;
   float dx2 = x3-x2;
   float dy2 = y3-y2;
   float dx = x3-x0;
   float dy = y3-y0;
   float longlen = (float) (STBTT_sqrt(dx0*dx0+dy0*dy0)+STBTT_sqrt(dx1*dx1+dy1*dy1)+STBTT_sqrt(dx2*dx2+dy2*dy2));
   float shortlen = (float) STBTT_sqrt(dx*dx+dy*dy);
   float flatness_squared = longlen*longlen-shortlen*shortlen;

   if (n > 16) // 65536 segments on one curve better be enough!
      return;

   if (flatness_squared > objspace_flatness_squared) {
      float x01 = (x0+x1)/2;
      float y01 = (y0+y1)/2;
      float x12 = (x1+x2)/2;
      float y12 = (y1+y2)/2;
      float x23 = (x2+x3)/2;
      float y23 = (y2+y3)/2;

      float xa = (x01+x12)/2;
      float ya = (y01+y12)/2;
      float xb = (x12+x23)/2;
      float yb = (y12+y23)/2;

      float mx = (xa+xb)/2;
      float my = (ya+yb)/2;

      stbtt__tesselate_cubic(points, num_points, x0,y0, x01,y01, xa,ya, mx,my, objspace_flatness_squared,n+1);
      stbtt__tesselate_cubic(points, num_points, mx,my, xb,yb, x23,y23, x3,y3, objspace_flatness_squared,n+1);
   } else {
      stbtt__add_point(points, *num_points,x3,y3);
      *num_points = *num_points+1;
   }
}